

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::RemoveDefinition(cmMakefile *this,string *name)

{
  bool bVar1;
  Internals *this_00;
  cmVariableWatch *this_01;
  cmVariableWatch *vv;
  string *name_local;
  cmMakefile *this_local;
  
  bVar1 = VariableInitialized(this,name);
  if (bVar1) {
    LogUnused(this,"unsetting",name);
  }
  this_00 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
  Internals::RemoveDefinition(this_00,name);
  this_01 = GetVariableWatch(this);
  if (this_01 != (cmVariableWatch *)0x0) {
    cmVariableWatch::VariableAccessed(this_01,name,4,(char *)0x0,this);
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefinition(const std::string& name)
{
  if (this->VariableInitialized(name))
    {
    this->LogUnused("unsetting", name);
    }
  this->Internal->RemoveDefinition(name);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if ( vv )
    {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_REMOVED_ACCESS,
      0, this);
    }
#endif
}